

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.cpp
# Opt level: O0

bool __thiscall Sock::Wait(Sock *this,milliseconds timeout,Event requested,Event *occurred)

{
  initializer_list<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_> __l;
  byte bVar1;
  pointer ppVar2;
  Event *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  EventsPerSock events_per_sock;
  shared_ptr<const_Sock> shared;
  Events *in_stack_fffffffffffffe98;
  pair<const_std::shared_ptr<const_Sock>,_Sock::Events> *this_00;
  pair<std::shared_ptr<const_Sock>,_Sock::Events> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  size_type in_stack_fffffffffffffeb0;
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  *in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffed0 [15];
  undefined1 in_stack_fffffffffffffedf;
  allocator_type *in_stack_fffffffffffffef0;
  long *plVar3;
  bool local_a1;
  pair<const_std::shared_ptr<const_Sock>,_Sock::Events> local_8d [2];
  shared_ptr<const_Sock> local_50;
  undefined8 local_40;
  long local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in_RSI;
  std::shared_ptr<Sock_const>::
  shared_ptr<Sock_const,Sock::Wait(std::chrono::duration<long,std::ratio<1l,1000l>>,unsigned_char,unsigned_char*)const::__0,void>
            (&local_50);
  Events::Events(in_stack_fffffffffffffe98,'\0');
  std::make_pair<std::shared_ptr<Sock_const>&,Sock::Events>
            (&in_stack_fffffffffffffea0->first,in_stack_fffffffffffffe98);
  std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>::
  pair<std::shared_ptr<const_Sock>,_Sock::Events,_true>
            ((pair<const_std::shared_ptr<const_Sock>,_Sock::Events> *)
             CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),in_stack_fffffffffffffea0
            );
  this_00 = local_8d;
  std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>::allocator
            ((allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_> *)
             in_stack_fffffffffffffe98);
  __l._M_len._7_1_ = in_stack_fffffffffffffedf;
  __l._0_15_ = in_stack_fffffffffffffed0;
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::unordered_map(in_stack_fffffffffffffeb8,__l,in_stack_fffffffffffffeb0,
                  (hasher *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                  (key_equal *)in_stack_fffffffffffffea0,in_stack_fffffffffffffef0);
  std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>::~allocator
            ((allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_> *)this_00);
  plVar3 = &local_8;
  do {
    plVar3 = plVar3 + -3;
    std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>::~pair(this_00);
  } while (plVar3 != local_20);
  std::pair<std::shared_ptr<const_Sock>,_Sock::Events>::~pair
            ((pair<std::shared_ptr<const_Sock>,_Sock::Events> *)this_00);
  bVar1 = (**(code **)(*in_RDI + 0x78))
                    (in_RDI,local_40,
                     (undefined1 *)
                     ((long)&local_8d[0].first.
                             super___shared_ptr<const_Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 5))
  ;
  if ((bVar1 & 1) == 0) {
    local_a1 = false;
  }
  else {
    if (in_RCX != (Event *)0x0) {
      std::
      unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
      ::begin((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
               *)in_stack_fffffffffffffea0);
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>,_false,_true>
                             *)this_00);
      *in_RCX = (ppVar2->second).occurred;
    }
    local_a1 = true;
  }
  std::
  unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
  ::~unordered_map((unordered_map<std::shared_ptr<const_Sock>,_Sock::Events,_Sock::HashSharedPtrSock,_Sock::EqualSharedPtrSock,_std::allocator<std::pair<const_std::shared_ptr<const_Sock>,_Sock::Events>_>_>
                    *)this_00);
  std::shared_ptr<const_Sock>::~shared_ptr(&this_00->first);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_a1;
  }
  __stack_chk_fail();
}

Assistant:

bool Sock::Wait(std::chrono::milliseconds timeout, Event requested, Event* occurred) const
{
    // We need a `shared_ptr` owning `this` for `WaitMany()`, but don't want
    // `this` to be destroyed when the `shared_ptr` goes out of scope at the
    // end of this function. Create it with a custom noop deleter.
    std::shared_ptr<const Sock> shared{this, [](const Sock*) {}};

    EventsPerSock events_per_sock{std::make_pair(shared, Events{requested})};

    if (!WaitMany(timeout, events_per_sock)) {
        return false;
    }

    if (occurred != nullptr) {
        *occurred = events_per_sock.begin()->second.occurred;
    }

    return true;
}